

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O3

long curlx_tvdiff(timeval newer,timeval older)

{
  return (newer.tv_usec - older.tv_usec) / 1000 + (newer.tv_sec - older.tv_sec) * 1000;
}

Assistant:

long curlx_tvdiff(struct timeval newer, struct timeval older)
{
  return (newer.tv_sec-older.tv_sec)*1000+
    (newer.tv_usec-older.tv_usec)/1000;
}